

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::Clear
          (CategoricalCrossEntropyLossLayer *this)

{
  uint32_t cached_has_bits;
  CategoricalCrossEntropyLossLayer *this_local;
  
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->input_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->target_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CategoricalCrossEntropyLossLayer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  input_.ClearToEmpty();
  target_.ClearToEmpty();
  _internal_metadata_.Clear<std::string>();
}